

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

upb_MiniTable *
upb_MtDecoder_BuildMiniTableWithBuf
          (upb_MtDecoder *decoder,char *data,size_t len,void **buf,size_t *buf_size)

{
  int iVar1;
  size_t *buf_size_local;
  void **buf_local;
  size_t len_local;
  char *data_local;
  upb_MtDecoder *decoder_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)(decoder->base).err);
  if (iVar1 == 0) {
    decoder_local =
         (upb_MtDecoder *)upb_MtDecoder_DoBuildMiniTableWithBuf(decoder,data,len,buf,buf_size);
  }
  else {
    *buf = (decoder->vec).data;
    *buf_size = (decoder->vec).capacity * 0xc;
    decoder_local = (upb_MtDecoder *)0x0;
  }
  return (upb_MiniTable *)decoder_local;
}

Assistant:

static upb_MiniTable* upb_MtDecoder_BuildMiniTableWithBuf(
    upb_MtDecoder* const decoder, const char* const data, const size_t len,
    void** const buf, size_t* const buf_size) {
  if (UPB_SETJMP(decoder->base.err) != 0) {
    *buf = decoder->vec.data;
    *buf_size = decoder->vec.capacity * sizeof(*decoder->vec.data);
    return NULL;
  }

  return upb_MtDecoder_DoBuildMiniTableWithBuf(decoder, data, len, buf,
                                               buf_size);
}